

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

bool Js::JavascriptString::BuildLastCharForwardBoyerMooreTable
               (Boyer_Moore_Jump *jmpTable,char16 *searchStr,int searchLen)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (searchLen < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xdd8,"(searchLen >= 1)","Table for non-empty string");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  memset(jmpTable,0,0x200);
  pcVar4 = searchStr + (long)searchLen + -1;
  bVar2 = true;
  if (searchStr <= pcVar4) {
    uVar5 = 0;
    do {
      uVar6 = (ulong)(ushort)*pcVar4;
      bVar2 = uVar6 < 0x80;
      if (!bVar2) {
        return bVar2;
      }
      if (jmpTable[uVar6].shift == 0) {
        jmpTable[uVar6].shift = (uint32)(uVar5 >> 1);
      }
      pcVar4 = pcVar4 + -1;
      uVar5 = uVar5 + 2;
    } while (searchStr <= pcVar4);
  }
  return bVar2;
}

Assistant:

bool JavascriptString::BuildLastCharForwardBoyerMooreTable(JmpTable jmpTable, const char16* searchStr, int searchLen)
    {
        AssertMsg(searchLen >= 1, "Table for non-empty string");
        memset(jmpTable, 0, sizeof(JmpTable));

        const char16 * p2 = searchStr + searchLen - 1;
        const char16 * const begin = searchStr;

        // Determine if we can do a partial ASCII Boyer-Moore
        while (p2 >= begin)
        {
            WCHAR c = *p2;
            if ( 0 == ( c & ~0x7f ))
            {
                if ( jmpTable[c].shift == 0 )
                {
                    jmpTable[c].shift = (uint32)(searchStr + searchLen - 1 - p2);
                }
            }
            else
            {
                return false;
            }
            p2--;
        }

        return true;
    }